

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

bool GLRParser::isMarkerMovedRight(Production *originalProduction,Production *productionMovedRight)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__y;
  string *__lhs;
  string *__rhs;
  ulong uVar4;
  const_reference pvVar5;
  const_reference __rhs_00;
  int i;
  ulong __n;
  string previoussymbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __x = Production::getToP_abi_cxx11_(originalProduction);
  __y = Production::getToP_abi_cxx11_(productionMovedRight);
  if ((long)(__x->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(__x->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(__y->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(__y->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    __lhs = Production::getFromP_abi_cxx11_(originalProduction);
    __rhs = Production::getFromP_abi_cxx11_(productionMovedRight);
    bVar1 = std::operator!=(__lhs,__rhs);
    if ((!bVar1) && (bVar1 = std::operator==(__x,__y), !bVar1)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      bVar1 = false;
      for (__n = 0; uVar4 = (long)(__x->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(__x->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5, __n < uVar4;
          __n = __n + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(__x,__n);
        __rhs_00 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(__y,__n);
        bVar2 = std::operator!=(pvVar5,__rhs_00);
        if (bVar2) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(__x,__n);
          getMarker_abi_cxx11_();
          _Var3 = std::operator==(pvVar5,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (_Var3) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(__y,__n);
            bVar1 = true;
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
          else {
            if (!bVar1) break;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(__x,__n);
            _Var3 = std::operator==(&local_70,pvVar5);
            if (!_Var3) break;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(__y,__n);
            getMarker_abi_cxx11_();
            _Var3 = std::operator==(pvVar5,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (!_Var3) break;
            std::__cxx11::string::assign((char *)&local_70);
            bVar1 = false;
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_70);
      return uVar4 <= __n;
    }
  }
  return false;
}

Assistant:

bool GLRParser::isMarkerMovedRight(Production *originalProduction, Production *productionMovedRight) {
    const auto &originalProductionTo = originalProduction->getToP();
    const auto &productionMovedRightTo = productionMovedRight->getToP();

    if (originalProductionTo.size() != productionMovedRightTo.size() ||
        originalProduction->getFromP() != productionMovedRight->getFromP() ||
        originalProductionTo == productionMovedRightTo) {
        return false;
    }

    bool previousMarker = false;
    std::string previoussymbol;
    for (int i = 0; i < originalProductionTo.size(); ++i) {
        if (originalProductionTo.at(i) != productionMovedRightTo.at(i)) {

            if (originalProductionTo.at(i) == getMarker()) {
                // Case: This is the original marker
                previousMarker = true;
                previoussymbol = productionMovedRightTo.at(i);

            } else if (previousMarker &&
                       previoussymbol == originalProductionTo.at(i) &&
                       productionMovedRightTo.at(i) == getMarker()) {
                // Case: This is the moved marker
                previoussymbol = "";
                previousMarker = false;

            } else {
                return false;
            }
        }
    }
    return true;
}